

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.h
# Opt level: O1

void __thiscall server::collectservmode::update(collectservmode *this)

{
  uint uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  token *ptVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  vector<int> resets;
  vector<int> local_38;
  
  if ((gamemillis < gamelimit) && (this->notgotbases == false)) {
    local_38.buf = (int *)0x0;
    local_38.alen = 0;
    local_38.ulen = 0;
    lVar10 = (long)(this->tokens).ulen;
    if (0 < lVar10) {
      lVar9 = lVar10 + 1;
      lVar10 = lVar10 << 5;
      do {
        ptVar5 = (this->tokens).buf;
        if (9999 < lastmillis - *(int *)((long)&ptVar5[-1].droptime + lVar10)) {
          vector<int>::add(&local_38,(int *)((long)&ptVar5[-1].id + lVar10));
          ptVar5 = (this->tokens).buf;
          iVar4 = (this->tokens).ulen;
          uVar1 = iVar4 - 1;
          (this->tokens).ulen = uVar1;
          if (1 < iVar4) {
            uVar6 = *(undefined8 *)(ptVar5 + uVar1);
            uVar7 = *(undefined8 *)&ptVar5[uVar1].droptime;
            puVar2 = (undefined8 *)((long)&ptVar5[uVar1].o.field_0 + 4);
            uVar8 = puVar2[1];
            puVar3 = (undefined8 *)((long)&ptVar5[-1].o.field_0 + lVar10 + 4);
            *puVar3 = *puVar2;
            puVar3[1] = uVar8;
            puVar2 = (undefined8 *)((long)&ptVar5[-1].id + lVar10);
            *puVar2 = uVar6;
            puVar2[1] = uVar7;
          }
        }
        lVar9 = lVar9 + -1;
        lVar10 = lVar10 + -0x20;
      } while (1 < lVar9);
    }
    if (local_38.ulen != 0) {
      sendf(-1,1,"rivi",0x6d,(ulong)(uint)local_38.ulen,local_38.buf,0xffffffff);
    }
    local_38._8_8_ = local_38._8_8_ & 0xffffffff;
    if (local_38.buf != (int *)0x0) {
      operator_delete__(local_38.buf);
    }
  }
  return;
}

Assistant:

void update()
    {
        if(gamemillis>=gamelimit || notgotbases) return;
        vector<int> resets;
        loopvrev(tokens)
        {
            token &t = tokens[i];
            if(lastmillis - t.droptime >= EXPIRETOKENTIME)
            {
                resets.add(t.id);
                tokens.removeunordered(i);
            }
        }
        if(resets.length())
            sendf(-1, 1, "rivi", N_EXPIRETOKENS, resets.length(), resets.getbuf(), -1);
    }